

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizard::setButtonLayout(QWizard *this,QList<QWizard::WizardButton> *layout)

{
  WizardButton which;
  QWizardPrivate *this_00;
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  if ((layout->d).size != 0) {
    uVar4 = 0;
    do {
      which = (layout->d).ptr[uVar4];
      bVar1 = false;
      if ((which != NoButton) && (which != NButtons)) {
        bVar2 = QWizardPrivate::ensureButton(this_00,which);
        bVar1 = true;
        if (bVar2) {
          if (uVar4 != 0) {
            uVar3 = 0;
            do {
              if ((layout->d).ptr[uVar3] == which) {
                local_58[0] = '\x02';
                local_58[1] = '\0';
                local_58[2] = '\0';
                local_58[3] = '\0';
                local_58[4] = '\0';
                local_58[5] = '\0';
                local_58[6] = '\0';
                local_58[7] = '\0';
                local_58[8] = '\0';
                local_58[9] = '\0';
                local_58[10] = '\0';
                local_58[0xb] = '\0';
                local_58[0xc] = '\0';
                local_58[0xd] = '\0';
                local_58[0xe] = '\0';
                local_58[0xf] = '\0';
                local_58[0x10] = '\0';
                local_58[0x11] = '\0';
                local_58[0x12] = '\0';
                local_58[0x13] = '\0';
                local_58[0x14] = '\0';
                local_58[0x15] = '\0';
                local_58[0x16] = '\0';
                local_58[0x17] = '\0';
                local_40 = "default";
                QMessageLogger::warning
                          (local_58,"QWizard::setButtonLayout: Duplicate button in layout");
                goto LAB_00517f49;
              }
              uVar3 = uVar3 + 1;
            } while (uVar4 != uVar3);
          }
          bVar1 = false;
        }
      }
LAB_00517f49:
      if (bVar1) goto LAB_00517fb0;
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)(layout->d).size);
  }
  this_00->buttonsHaveCustomLayout = true;
  QArrayDataPointer<QWizard::WizardButton>::operator=(&(this_00->buttonsCustomLayout).d,&layout->d);
  QWizardPrivate::updateButtonLayout(this_00);
LAB_00517fb0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizard::setButtonLayout(const QList<WizardButton> &layout)
{
    Q_D(QWizard);

    for (int i = 0; i < layout.size(); ++i) {
        WizardButton button1 = layout.at(i);

        if (button1 == NoButton || button1 == Stretch)
            continue;
        if (!d->ensureButton(button1))
            return;

        // O(n^2), but n is very small
        for (int j = 0; j < i; ++j) {
            WizardButton button2 = layout.at(j);
            if (Q_UNLIKELY(button2 == button1)) {
                qWarning("QWizard::setButtonLayout: Duplicate button in layout");
                return;
            }
        }
    }

    d->buttonsHaveCustomLayout = true;
    d->buttonsCustomLayout = layout;
    d->updateButtonLayout();
}